

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadCellOutputNum(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  Scl_Item_t *pPin;
  
  uVar1 = pCell->Child;
  if ((int)uVar1 < p->nItems) {
    iVar5 = 0;
    if ((int)uVar1 < 0) {
      pPin = (Scl_Item_t *)0x0;
    }
    else {
      pPin = p->pItems + uVar1;
    }
    if (pPin != (Scl_Item_t *)0x0) {
      iVar5 = 0;
      do {
        iVar3 = (pPin->Key).Beg;
        iVar2 = (pPin->Key).End - iVar3;
        iVar3 = strncmp(p->pContents + iVar3,"pin",(long)iVar2);
        if (iVar2 == 3 && iVar3 == 0) {
          pcVar4 = Scl_LibertyReadPinFormula(p,pPin);
          iVar5 = (iVar5 + 1) - (uint)(pcVar4 == (char *)0x0);
        }
        uVar1 = pPin->Next;
        if (p->nItems <= (int)uVar1) goto LAB_0045d5aa;
        if ((int)uVar1 < 0) {
          pPin = (Scl_Item_t *)0x0;
        }
        else {
          pPin = p->pItems + uVar1;
        }
      } while (pPin != (Scl_Item_t *)0x0);
    }
    return iVar5;
  }
LAB_0045d5aa:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadCellOutputNum( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        if ( Scl_LibertyReadPinFormula(p, pPin) )
            Counter++;
    return Counter;
}